

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall
toml::detail::repeat_at_least::expected_chars_abi_cxx11_(repeat_at_least *this,location *loc)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  region reg;
  size_t i;
  region *in_stack_ffffffffffffff40;
  string *this_00;
  allocator<char> local_99;
  uint local_98;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  ulong local_20;
  
  local_20 = 0;
  this_00 = in_RDI;
  while( true ) {
    if (*(ulong *)(in_RSI + 8) <= local_20) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::allocator<char>::~allocator(&local_99);
      return in_RDI;
    }
    scanner_storage::scan((scanner_storage *)this_00,(location *)in_stack_ffffffffffffff40);
    bVar1 = region::is_ok((region *)0x200aa1);
    if (!bVar1) {
      scanner_storage::expected_chars_abi_cxx11_
                ((scanner_storage *)this_00,(location *)in_stack_ffffffffffffff40);
    }
    local_98 = (uint)!bVar1;
    region::~region(in_stack_ffffffffffffff40);
    if (local_98 != 0) break;
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string repeat_at_least::expected_chars(location& loc) const
{
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            return other_.expected_chars(loc);
        }
    }
    assert(false);
    return "";
}